

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

SimpleString __thiscall
JUnitTestOutput::encodeFileName(JUnitTestOutput *this,SimpleString *fileName)

{
  size_t extraout_RDX;
  size_t sVar1;
  size_t extraout_RDX_00;
  SimpleString *in_RDI;
  SimpleString SVar2;
  char *sym;
  SimpleString *result;
  char in_stack_ffffffffffffffce;
  char in_stack_ffffffffffffffcf;
  SimpleString *in_stack_ffffffffffffffd0;
  char *local_28;
  
  SimpleString::SimpleString(in_RDI,in_RDI);
  sVar1 = extraout_RDX;
  for (local_28 = "/\\?%*:|\"<>"; *local_28 != '\0'; local_28 = local_28 + 1) {
    SimpleString::replace
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcf,in_stack_ffffffffffffffce);
    sVar1 = extraout_RDX_00;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)in_RDI;
  return SVar2;
}

Assistant:

SimpleString JUnitTestOutput::encodeFileName(const SimpleString& fileName)
{
    // special character list based on: https://en.wikipedia.org/wiki/Filename
    static const char* const forbiddenCharacters = "/\\?%*:|\"<>";

    SimpleString result = fileName;
    for (const char* sym = forbiddenCharacters; *sym; ++sym) {
        result.replace(*sym, '_');
    }
    return result;
}